

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

void BinaryCache::PutBytecode(char *path,char *bytecode,Lexeme *lexStart,uint lexCount)

{
  uint uVar1;
  CodeDescriptor *pCVar2;
  size_t sVar3;
  char *__dest;
  Lexeme *__dest_00;
  ulong uVar4;
  uint *puVar5;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 != lastHash) {
    if ((ulong)DAT_0041ef2c == 0) {
      uVar4 = 0;
LAB_00239de9:
      if ((uint)uVar4 != DAT_0041ef2c) {
        __assert_fail("i == cache.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0x69,
                      "void BinaryCache::PutBytecode(const char *, const char *, Lexeme *, unsigned int)"
                     );
      }
    }
    else {
      puVar5 = (uint *)(cache + 8);
      uVar4 = 0;
      do {
        if (uVar1 == *puVar5) goto LAB_00239de9;
        uVar4 = uVar4 + 1;
        puVar5 = puVar5 + 10;
      } while (DAT_0041ef2c != uVar4);
    }
    pCVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::push_back
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache);
    sVar3 = strlen(path);
    __dest = (char *)(*(code *)NULLC::alloc)((int)sVar3 + 1);
    strcpy(__dest,path);
    pCVar2->name = __dest;
    pCVar2->nameHash = uVar1;
    pCVar2->binary = bytecode;
    if (lexStart == (Lexeme *)0x0) {
      pCVar2->lexemes = (Lexeme *)0x0;
      lexCount = 0;
    }
    else {
      __dest_00 = (Lexeme *)operator_new__((ulong)lexCount << 5);
      pCVar2->lexemes = __dest_00;
      memcpy(__dest_00,lexStart,(ulong)lexCount << 5);
    }
    pCVar2->lexemeCount = lexCount;
  }
  return;
}

Assistant:

void BinaryCache::PutBytecode(const char* path, const char* bytecode, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	assert(i == cache.size());

	BinaryCache::CodeDescriptor *desc = cache.push_back();
	unsigned int pathLen = (unsigned int)strlen(path);
	desc->name = strcpy((char*)NULLC::alloc(pathLen + 1), path);
	desc->nameHash = hash;
	desc->binary = bytecode;
	if(lexStart)
	{
		desc->lexemes = new Lexeme[lexCount];
		memcpy(desc->lexemes, lexStart, lexCount * sizeof(Lexeme));
		desc->lexemeCount = lexCount;
	}else{
		desc->lexemes = NULL;
		desc->lexemeCount = 0;
	}
}